

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O3

void stk_InitFull(SolStack_t *stackPtr)

{
  int iVar1;
  ulong uVar2;
  time_t tVar3;
  ECardType_t ct;
  ECardType_t EVar4;
  ulong uVar5;
  int iVar6;
  ECardColor_t cc;
  ECardColor_t EVar7;
  long lVar8;
  
  if (stackPtr != (SolStack_t *)0x0) {
    EVar7 = CC_SPADES;
    memset(stackPtr,0,0x278);
    uVar2 = 0;
    do {
      EVar4 = CT_ACE;
      uVar5 = uVar2;
      do {
        if (uVar5 < 0x34) {
          uVar2 = uVar5 + 1;
          stackPtr->m_size = uVar2;
          stackPtr->m_cards[uVar5].m_color = EVar7;
          stackPtr->m_cards[uVar5].m_type = EVar4;
          stackPtr->m_cards[uVar5].m_face = CF_DOWN;
          uVar5 = uVar2;
        }
        EVar4 = EVar4 + CT_ACE;
      } while (EVar4 != NUM_CARD_TYPES);
      EVar7 = EVar7 + CC_HEARTS;
    } while (EVar7 != NUM_CARD_COLORS);
    tVar3 = time((time_t *)0x0);
    srand((uint)tVar3);
    iVar6 = (int)stackPtr->m_size;
    if (-1 < (int)(iVar6 - 1U)) {
      lVar8 = (ulong)(iVar6 - 1U) * 0xc;
      do {
        iVar1 = rand();
        card_Swap((Card_t *)((long)&stackPtr->m_cards[0].m_type + lVar8),
                  stackPtr->m_cards + iVar1 % iVar6);
        iVar6 = iVar6 + -1;
        lVar8 = lVar8 + -0xc;
      } while (lVar8 != -0xc);
    }
  }
  return;
}

Assistant:

void stk_InitFull(SolStack_t* stackPtr)
{
  if (stackPtr) {
    stk_InitEmpty(stackPtr);
    // fill the stack with all combinations of color and type
    for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
      for (ECardType_t ct = CT_ACE; ct <= CT_KING; ct++) {
        PushNew(stackPtr, cc, ct);
      }
    }

    Shuffle(stackPtr);
  }
}